

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

void __thiscall
wasm::anon_unknown_0::CanonicalizationState::updateUses
          (CanonicalizationState *this,ReplacementMap *replacements,
          unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
          *info)

{
  uintptr_t uVar1;
  int iVar2;
  anon_union_8_2_a60233d5_for_Task_2 aVar3;
  __buckets_ptr pp_Var4;
  __node_base_ptr p_Var5;
  pointer pHVar6;
  uintptr_t uVar7;
  __node_ptr p_Var8;
  __hash_code __code;
  __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> __tmp;
  anon_union_8_2_a60233d5_for_Task_2 aVar9;
  pair<std::__detail::_Node_iterator<wasm::HeapType,_true,_true>,_bool> pVar10;
  __buckets_ptr local_c0;
  HeapType root;
  _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_a0;
  char local_68;
  CanonicalizationState *local_60;
  ReplacementMap *local_50;
  CanonicalizationState *local_48;
  undefined8 local_40;
  anon_union_8_2_a60233d5_for_Task_2 local_38;
  
  if ((this->newInfos).
      super__Vector_base<std::unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>,_std::allocator<std::unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    local_c0 = (replacements->_M_h)._M_buckets;
    local_38.type = (Type *)&local_c0;
    local_a0._M_buckets = &local_a0._M_single_bucket;
    root.id = 0;
    local_a0._M_bucket_count = 1;
    local_a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_a0._M_element_count = 0;
    local_a0._M_rehash_policy._M_max_load_factor = 1.0;
    local_a0._M_rehash_policy._M_next_resize = 0;
    local_a0._M_single_bucket = (__node_base_ptr)0x0;
    local_68 = '\x01';
    local_40 = (_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)CONCAT44(local_40._4_4_,3);
    local_60 = this;
    local_50 = replacements;
    local_48 = this;
    std::
    vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
    ::push_back((vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                 *)&root,(value_type *)&local_40);
    if (root.id != 0) {
      uVar7 = 0;
      do {
        uVar1 = uVar7 - 0x10;
        aVar3 = (anon_union_8_2_a60233d5_for_Task_2)
                ((anon_union_8_2_a60233d5_for_Task_2 *)(uVar7 - 8))->type;
        if (*(int *)(uVar7 - 0x10) == 3) {
          local_40 = (_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      *)CONCAT44(local_40._4_4_,5);
          local_38 = aVar3;
          std::
          vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
          ::push_back((vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                       *)&root,(value_type *)&local_40);
          if (local_68 == '\x01') {
            local_40 = &local_a0;
            pVar10 = std::
                     _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                     ::
                     _M_insert<wasm::HeapType_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::HeapType,true>>>>
                               ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                 *)local_40,aVar3.type,(value_type *)&local_40);
            if ((((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
               (pp_Var4 = *(__buckets_ptr *)aVar3, (__buckets_ptr)0xd < pp_Var4)) {
              iVar2 = *(int *)(pp_Var4 + 4);
              if (iVar2 == 3) {
                local_38.type = (Type *)(pp_Var4 + 5);
                local_40 = (_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                            *)CONCAT44(local_40._4_4_,2);
                std::
                vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                ::push_back((vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                             *)&root,(value_type *)&local_40);
              }
              else if (iVar2 == 2) {
                aVar9 = (anon_union_8_2_a60233d5_for_Task_2)
                        ((anon_union_8_2_a60233d5_for_Task_2 *)(pp_Var4 + 6))->type;
                while ((__node_base_ptr)aVar9.type != pp_Var4[5]) {
                  aVar9.type = aVar9.type + -2;
                  local_40 = (_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                              *)CONCAT44(local_40._4_4_,2);
                  local_38.type = aVar9.type;
                  std::
                  vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                  ::push_back((vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                               *)&root,(value_type *)&local_40);
                }
              }
              else if (iVar2 == 1) {
                local_38.type = (Type *)(pp_Var4 + 6);
                local_40._0_4_ = ScanType;
                std::
                vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                ::push_back((vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                             *)&root,(value_type *)&local_40);
                local_38.type = (Type *)(pp_Var4 + 5);
                local_40 = (_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                            *)CONCAT44(local_40._4_4_,2);
                std::
                vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                ::push_back((vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                             *)&root,(value_type *)&local_40);
              }
            }
          }
          else {
            pHVar6 = (local_60->results).
                     super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            p_Var8 = std::
                     _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::_M_find_node((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                     *)(local_60->results).
                                       super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                       ._M_impl.super__Vector_impl_data._M_start,(size_type)pHVar6,
                                    (key_type *)((ulong)(aVar3.type)->id % (ulong)pHVar6),
                                    (__hash_code)(aVar3.type)->id);
            if (p_Var8 != (__node_ptr)0x0) {
              (aVar3.type)->id =
                   (uintptr_t)
                   *(__buckets_ptr *)
                    ((long)&(p_Var8->
                            super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>_>
                            ._M_storage._M_storage + 8);
            }
          }
          local_40 = (_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      *)CONCAT44(local_40._4_4_,1);
          local_38 = aVar3;
          std::
          vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
          ::push_back((vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                       *)&root,(value_type *)&local_40);
        }
        else if (*(int *)(uVar7 - 0x10) == 2) {
          local_40._0_4_ = PostType;
          local_38 = aVar3;
          std::
          vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
          ::push_back((vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                       *)&root,(value_type *)&local_40);
          pp_Var4 = *(__buckets_ptr *)aVar3;
          local_68 = '\0';
          if ((__buckets_ptr)0x6 < pp_Var4) {
            if (*(int *)((long)pp_Var4 + 4) == 1) {
              local_38.type = (Type *)(pp_Var4 + 1);
              local_40._0_4_ = ScanHeapType;
              std::
              vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
              ::push_back((vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                           *)&root,(value_type *)&local_40);
            }
            else if (*(int *)((long)pp_Var4 + 4) == 0) {
              aVar9 = (anon_union_8_2_a60233d5_for_Task_2)
                      ((anon_union_8_2_a60233d5_for_Task_2 *)(pp_Var4 + 2))->type;
              while ((__node_base_ptr)aVar9.type != pp_Var4[1]) {
                aVar9.type = aVar9.type + -1;
                local_40._0_4_ = ScanType;
                local_38.type = aVar9.type;
                std::
                vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                ::push_back((vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                             *)&root,(value_type *)&local_40);
              }
            }
          }
          local_40 = (_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      *)((ulong)local_40._4_4_ << 0x20);
          local_38 = aVar3;
          std::
          vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
          ::push_back((vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                       *)&root,(value_type *)&local_40);
        }
        uVar7 = uVar1;
      } while (root.id != uVar1);
    }
    std::
    _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_a0);
    if (root.id != 0) {
      operator_delete((void *)root.id,-root.id);
    }
    pp_Var4 = (local_50->_M_h)._M_buckets;
    p_Var5 = pp_Var4[1];
    if ((p_Var5 != (__node_base_ptr)0x0) &&
       (pHVar6 = (local_48->results).
                 super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                 super__Vector_impl_data._M_finish,
       p_Var8 = std::
                _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::_M_find_node((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                *)(local_48->results).
                                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                  ._M_impl.super__Vector_impl_data._M_start,(size_type)pHVar6,
                               (key_type *)((ulong)p_Var5 % (ulong)pHVar6),(__hash_code)p_Var5),
       p_Var8 != (__node_ptr)0x0)) {
      p_Var5 = *(__node_base_ptr *)
                ((long)&(p_Var8->
                        super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>,_true>
                        ).
                        super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>_>
                        ._M_storage._M_storage + 8);
      if (p_Var5 < (__node_base_ptr)0xe) {
        __assert_fail("!ht.isBasic()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-type.cpp"
                      ,0x1bc,"HeapTypeInfo *wasm::(anonymous namespace)::getHeapTypeInfo(HeapType)")
        ;
      }
      pp_Var4[1] = p_Var5;
    }
  }
  return;
}

Assistant:

void CanonicalizationState::updateUses(ReplacementMap& replacements,
                                       std::unique_ptr<HeapTypeInfo>& info) {
  if (replacements.empty()) {
    return;
  }
  // Replace all old types reachable from `info`.
  struct ChildUpdater : HeapTypeChildWalker<ChildUpdater> {
    ReplacementMap& replacements;
    ChildUpdater(ReplacementMap& replacements) : replacements(replacements) {}
    void noteChild(HeapType* child) {
      if (auto it = replacements.find(*child); it != replacements.end()) {
        *child = it->second.getAsHeapType();
      }
    }
  };
  HeapType root = asHeapType(info);
  ChildUpdater(replacements).walkRoot(&root);

  // We may need to update its supertype as well.
  if (info->supertype) {
    HeapType super(uintptr_t(info->supertype));
    if (auto it = replacements.find(super); it != replacements.end()) {
      info->supertype = getHeapTypeInfo(it->second.getAsHeapType());
    }
  }
}